

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getSamplerTypeStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int numLayers,bool isUint,
          bool isSint)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_1b8;
  ostringstream local_190 [8];
  ostringstream str;
  bool isSint_local;
  bool isUint_local;
  int numLayers_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if ((numLayers & 1U) == 0) {
    local_1b8 = "";
    if (isUint) {
      local_1b8 = "i";
    }
  }
  else {
    local_1b8 = "u";
  }
  poVar1 = std::operator<<((ostream *)local_190,local_1b8);
  poVar1 = std::operator<<(poVar1,"sampler2DMS");
  pcVar2 = "";
  if (1 < (int)this) {
    pcVar2 = "Array";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getSamplerTypeStr (const int numLayers, const bool isUint, const bool isSint)
{
	std::ostringstream str;
	str << (isUint ? "u" : isSint ? "i" : "") << "sampler2DMS" << (numLayers > 1 ? "Array" : "");
	return str.str();
}